

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamMultiMerger_p.h
# Opt level: O2

void __thiscall
BamTools::Internal::MultiMerger<BamTools::Algorithms::Sort::Unsorted>::Remove
          (MultiMerger<BamTools::Algorithms::Sort::Unsorted> *this,BamReader *reader)

{
  _Elt_pointer pMVar1;
  __type _Var2;
  _Elt_pointer pMVar3;
  _Elt_pointer pMVar4;
  string filenameToRemove;
  _Map_pointer local_a8;
  _Elt_pointer local_a0;
  string local_90;
  iterator local_70;
  const_iterator local_50;
  
  if (reader != (BamReader *)0x0) {
    BamReader::GetFilename_abi_cxx11_(&local_90,reader);
    pMVar4 = (this->m_data).
             super__Deque_base<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pMVar3 = (this->m_data).
             super__Deque_base<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    local_a8 = (this->m_data).
               super__Deque_base<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
    pMVar1 = (this->m_data).
             super__Deque_base<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_a0 = (this->m_data).
               super__Deque_base<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
               ._M_impl.super__Deque_impl_data._M_start._M_first;
    while (pMVar4 != pMVar1) {
      if (pMVar4->Reader != (BamReader *)0x0) {
        BamReader::GetFilename_abi_cxx11_((string *)&local_70,pMVar4->Reader);
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_70,&local_90);
        std::__cxx11::string::~string((string *)&local_70);
        if (_Var2) {
          local_50._M_first = local_a0;
          local_50._M_node = local_a8;
          local_50._M_cur = pMVar4;
          local_50._M_last = pMVar3;
          std::deque<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
          ::erase(&local_70,&this->m_data,&local_50);
          break;
        }
      }
      pMVar4 = pMVar4 + 1;
      if (pMVar4 == pMVar3) {
        pMVar4 = local_a8[1];
        local_a8 = local_a8 + 1;
        pMVar3 = pMVar4 + 0x20;
        local_a0 = pMVar4;
      }
    }
    std::__cxx11::string::~string((string *)&local_90);
  }
  return;
}

Assistant:

inline void MultiMerger<Algorithms::Sort::Unsorted>::Remove(BamReader* reader)
{

    if (reader == 0) return;
    const std::string filenameToRemove = reader->GetFilename();

    // iterate over readers in cache
    DataIterator dataIter = m_data.begin();
    DataIterator dataEnd = m_data.end();
    for (; dataIter != dataEnd; ++dataIter) {
        const MergeItem& item = (*dataIter);
        const BamReader* itemReader = item.Reader;
        if (itemReader == 0) continue;

        // remove iterator on match
        if (itemReader->GetFilename() == filenameToRemove) {
            m_data.erase(dataIter);
            return;
        }
    }
}